

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::TypedArrayBase::HasPropertyQuery
          (TypedArrayBase *this,PropertyId propertyId,PropertyValueInfo *info)

{
  ScriptContext *this_00;
  BOOL BVar1;
  PropertyQueryFlags PVar2;
  PropertyRecord *pPVar3;
  PropertyString *aValue;
  double local_38;
  double result;
  uint32 index;
  
  result._4_4_ = 0;
  this_00 = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  BVar1 = ScriptContext::IsNumericPropertyId(this_00,propertyId,(uint32 *)((long)&result + 4));
  if (BVar1 == 0) {
    pPVar3 = ScriptContext::GetPropertyName(this_00,propertyId);
    if (pPVar3->isSymbol == false) {
      aValue = ScriptContext::GetPropertyString(this_00,propertyId);
      BVar1 = JavascriptConversion::CanonicalNumericIndexString
                        (&aValue->super_JavascriptString,&local_38,this_00);
      if (BVar1 != 0) {
        return Property_NotFound_NoProto;
      }
    }
    PVar2 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,info);
  }
  else {
    PVar2 = Property_NotFound_NoProto -
            (result._4_4_ < (this->super_ArrayBufferParent).super_ArrayObject.length);
  }
  return PVar2;
}

Assistant:

PropertyQueryFlags TypedArrayBase::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        uint32 index = 0;
        ScriptContext *scriptContext = GetScriptContext();
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            // All the slots within the length of the array are valid.
            return index < this->GetLength() ? PropertyQueryFlags::Property_Found : PropertyQueryFlags::Property_NotFound_NoProto;
        }

        if (!scriptContext->GetPropertyName(propertyId)->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return PropertyQueryFlags::Property_NotFound_NoProto;
        }

        return DynamicObject::HasPropertyQuery(propertyId, info);
    }